

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::Session(Session *this)

{
  bool bVar1;
  int iVar2;
  ReusableStringStream *pRVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *this_00;
  IMutableContext *pIVar5;
  ostream *poVar6;
  ostream *poVar7;
  undefined1 auVar8 [12];
  Parser local_170 [2];
  exception *ex;
  reference local_a8;
  exception_ptr *ex_ptr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *__range2;
  undefined1 local_80 [7];
  Colour colourGuard;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *exceptions;
  ReusableStringStream local_58;
  string local_40;
  undefined4 local_1c;
  undefined8 local_18;
  Session *local_10;
  Session *this_local;
  
  local_10 = this;
  NonCopyable::NonCopyable(&this->super_NonCopyable);
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Session_003ba0b8;
  clara::detail::Parser::Parser(&this->m_cli);
  ConfigData::ConfigData(&this->m_configData);
  clara::std::shared_ptr<Catch::Config>::shared_ptr(&this->m_config);
  this->m_startupExceptions = false;
  if ((Session::alreadyInstantiated & 1U) != 0) {
    ReusableStringStream::ReusableStringStream(&local_58);
    SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)&exceptions,
               "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/catch.hpp"
               ,0x3467);
    pRVar3 = ReusableStringStream::operator<<(&local_58,(SourceLineInfo *)&exceptions);
    pRVar3 = ReusableStringStream::operator<<(pRVar3,(char (*) [26])": Internal Catch2 error: ");
    pRVar3 = ReusableStringStream::operator<<
                       (pRVar3,(char (*) [53])"Only one instance of Catch::Session can ever be used"
                       );
    ReusableStringStream::str_abi_cxx11_(&local_40,pRVar3);
    throw_logic_error(&local_40);
  }
  pIVar4 = getRegistryHub();
  iVar2 = (*pIVar4->_vptr_IRegistryHub[6])();
  this_00 = StartupExceptionRegistry::getExceptions
                      ((StartupExceptionRegistry *)CONCAT44(extraout_var,iVar2));
  bVar1 = clara::std::
          vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
          ::empty(this_00);
  if (!bVar1) {
    config(this);
    pIVar5 = getCurrentMutableContext();
    std::shared_ptr<Catch::IConfig_const>::shared_ptr<Catch::Config,void>
              ((shared_ptr<Catch::IConfig_const> *)local_80,&this->m_config);
    (*(pIVar5->super_IContext)._vptr_IContext[7])
              (pIVar5,(shared_ptr<Catch::IConfig_const> *)local_80);
    clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr
              ((shared_ptr<const_Catch::IConfig> *)local_80);
    this->m_startupExceptions = true;
    Colour::Colour((Colour *)((long)&__range2 + 7),Red);
    poVar6 = cerr();
    poVar7 = std::operator<<((ostream *)poVar6,"Errors occurred during startup!");
    std::operator<<(poVar7,'\n');
    __end2 = clara::std::
             vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
             ::begin(this_00);
    ex_ptr = (exception_ptr *)
             clara::std::
             vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
             ::end(this_00);
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
                                *)&ex_ptr);
    if (bVar1) {
      local_a8 = __gnu_cxx::
                 __normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
                 ::operator*(&__end2);
      clara::std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)&ex,local_a8);
      auVar8 = std::rethrow_exception((exception_ptr)&ex);
      local_1c = auVar8._8_4_;
      local_18 = auVar8._0_8_;
      clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr
                ((shared_ptr<const_Catch::IConfig> *)local_80);
      clara::std::shared_ptr<Catch::Config>::~shared_ptr(&this->m_config);
      ConfigData::~ConfigData(&this->m_configData);
      clara::detail::Parser::~Parser(&this->m_cli);
      NonCopyable::~NonCopyable(&this->super_NonCopyable);
      _Unwind_Resume(local_18);
    }
    Colour::~Colour((Colour *)((long)&__range2 + 7));
  }
  Session::alreadyInstantiated = true;
  makeCommandLineParser(local_170,&this->m_configData);
  clara::detail::Parser::operator=(&this->m_cli,local_170);
  clara::detail::Parser::~Parser(local_170);
  return;
}

Assistant:

Session::Session() {
        static bool alreadyInstantiated = false;
        if( alreadyInstantiated ) {
            CATCH_TRY { CATCH_INTERNAL_ERROR( "Only one instance of Catch::Session can ever be used" ); }
            CATCH_CATCH_ALL { getMutableRegistryHub().registerStartupException(); }